

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O1

MomentumType * __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::ConstParticleRef::getMomentum
          (MomentumType *__return_storage_ptr__,ConstParticleRef *this)

{
  double dVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  long lVar4;
  MomentumType result;
  
  result.x = 0.0;
  result.y = 0.0;
  result.z = 0.0;
  pvVar3 = this->particles->ps;
  iVar2 = this->idx;
  lVar4 = 0;
  do {
    (&result.x)[lVar4] =
         (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[iVar2];
    lVar4 = lVar4 + 1;
    pvVar3 = pvVar3 + 1;
  } while (lVar4 != 3);
  dVar1 = *(double *)
           (ParticleTypes::types +
           (long)(this->particles->typeIndex).super__Vector_base<short,_std::allocator<short>_>.
                 _M_impl.super__Vector_impl_data._M_start[this->idx] * 0x10);
  __return_storage_ptr__->x = dVar1 * result.x * 29979245800.0;
  __return_storage_ptr__->y = dVar1 * result.y * 29979245800.0;
  __return_storage_ptr__->z = result.z * 29979245800.0 * dVar1;
  return __return_storage_ptr__;
}

Assistant:

MomentumType getMomentum() const {
            MomentumType result;
            for (int d = 0; d < momentumDimension; d++)
                result[d] = particles.ps[d][idx];
            return result * Constants<GammaType>::c() * pica::ParticleTypes::types[particles.typeIndex[idx]].mass;
        }